

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

bool __thiscall QPDFFormFieldObjectHelper::isChoice(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  string local_30;
  QPDFFormFieldObjectHelper *local_10;
  QPDFFormFieldObjectHelper *this_local;
  
  local_10 = this;
  getFieldType_abi_cxx11_(&local_30,this);
  bVar1 = std::operator==(&local_30,"/Ch");
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isChoice()
{
    return (getFieldType() == "/Ch");
}